

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_amend.c
# Opt level: O0

LY_ERR lysp_ext_dup(ly_ctx *ctx,lysp_module *pmod,void *parent,ly_stmt parent_stmt,
                   lysp_ext_instance *orig_ext,lysp_ext_instance *ext)

{
  undefined1 local_98 [8];
  lysp_ctx pctx;
  ly_set pmods;
  LY_ERR ret;
  lysp_ext_instance *ext_local;
  lysp_ext_instance *orig_ext_local;
  ly_stmt parent_stmt_local;
  void *parent_local;
  lysp_module *pmod_local;
  ly_ctx *ctx_local;
  
  memset(&pctx.main_ctx,0,0x10);
  memset(local_98,0,0x48);
  pctx.ext_inst.field_2.dnodes = (lyd_node **)&pctx.main_ctx;
  pmods.field_2._4_4_ = lydict_dup(ctx,orig_ext->name,&ext->name);
  if ((pmods.field_2._4_4_ == LY_SUCCESS) &&
     (pmods.field_2._4_4_ = lydict_dup(ctx,orig_ext->argument,&ext->argument),
     pmods.field_2._4_4_ == LY_SUCCESS)) {
    ext->format = orig_ext->format;
    pmods.field_2._4_4_ =
         ly_dup_prefix_data(ctx,orig_ext->format,orig_ext->prefix_data,&ext->prefix_data);
    if (pmods.field_2._4_4_ == LY_SUCCESS) {
      ext->def = orig_ext->def;
      ext->parent = parent;
      ext->parent_stmt = parent_stmt;
      ext->parent_stmt_index = orig_ext->parent_stmt_index;
      ext->flags = orig_ext->flags;
      ext->record = orig_ext->record;
      pmods.field_2._4_4_ = lysp_ext_children_dup(ctx,orig_ext->child,&ext->child);
      if ((((pmods.field_2._4_4_ == LY_SUCCESS) && (ext->record != (lyplg_ext_record *)0x0)) &&
          ((ext->record->plugin).parse != (lyplg_ext_parse_clb)0x0)) &&
         (pmods.field_2._4_4_ = ly_set_add((ly_set *)&pctx.main_ctx,pmod,'\x01',(uint32_t *)0x0),
         pmods.field_2._4_4_ == LY_SUCCESS)) {
        pmods.field_2._4_4_ = (*(ext->record->plugin).parse)((lysp_ctx *)local_98,ext);
      }
    }
  }
  ly_set_erase((ly_set *)&pctx.main_ctx,(_func_void_void_ptr *)0x0);
  return pmods.field_2._4_4_;
}

Assistant:

static LY_ERR
lysp_ext_dup(const struct ly_ctx *ctx, const struct lysp_module *pmod, void *parent, enum ly_stmt parent_stmt,
        const struct lysp_ext_instance *orig_ext, struct lysp_ext_instance *ext)
{
    LY_ERR ret = LY_SUCCESS;
    struct ly_set pmods = {0};
    struct lysp_ctx pctx = {.parsed_mods = &pmods};

    DUP_STRING_GOTO(ctx, orig_ext->name, ext->name, ret, cleanup);
    DUP_STRING_GOTO(ctx, orig_ext->argument, ext->argument, ret, cleanup);
    ext->format = orig_ext->format;
    LY_CHECK_GOTO(ret = ly_dup_prefix_data(ctx, orig_ext->format, orig_ext->prefix_data, &ext->prefix_data), cleanup);
    ext->def = orig_ext->def;

    ext->parent = parent;
    ext->parent_stmt = parent_stmt;
    ext->parent_stmt_index = orig_ext->parent_stmt_index;
    ext->flags = orig_ext->flags;
    ext->record = orig_ext->record;

    LY_CHECK_GOTO(ret = lysp_ext_children_dup(ctx, orig_ext->child, &ext->child), cleanup);
    if (ext->record && ext->record->plugin.parse) {
        /* parse again */
        LY_CHECK_GOTO(ret = ly_set_add(&pmods, pmod, 1, NULL), cleanup);
        LY_CHECK_GOTO(ret = ext->record->plugin.parse(&pctx, ext), cleanup);
    }

cleanup:
    ly_set_erase(&pmods, NULL);
    return ret;
}